

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

__pid_t __thiscall
kj::Promise<kj::HttpClient::Response>::wait
          (Promise<kj::HttpClient::Response> *this,void *__stat_loc)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  WaitScope *in_RDX;
  undefined4 *puVar8;
  ExceptionOr<kj::HttpClient::Response> result;
  ExceptionOrValue local_1b8;
  char local_58;
  undefined4 local_50 [8];
  Disposer *local_30;
  PromiseNode *local_28;
  
  local_1b8.exception.ptr.isSet = false;
  local_58 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_1b8,in_RDX);
  puVar8 = (undefined4 *)0x0;
  if (local_58 != '\0') {
    puVar8 = local_50;
  }
  if (local_58 != '\x01') {
    if (local_1b8.exception.ptr.isSet == false) {
      _::unreachable();
    }
    throwFatalException(&local_1b8.exception.ptr.field_1.value,0);
  }
  exception = &local_1b8.exception.ptr.field_1;
  if (local_1b8.exception.ptr.isSet != false) {
    throwRecoverableException(&exception->value,0);
  }
  uVar1 = *puVar8;
  uVar2 = puVar8[1];
  uVar3 = puVar8[2];
  uVar4 = puVar8[3];
  uVar5 = puVar8[5];
  uVar6 = puVar8[6];
  uVar7 = puVar8[7];
  *(undefined4 *)&this[1].super_PromiseBase.node.disposer = puVar8[4];
  *(undefined4 *)((long)&this[1].super_PromiseBase.node.disposer + 4) = uVar5;
  *(undefined4 *)&this[1].super_PromiseBase.node.ptr = uVar6;
  *(undefined4 *)((long)&this[1].super_PromiseBase.node.ptr + 4) = uVar7;
  *(undefined4 *)&(this->super_PromiseBase).node.disposer = uVar1;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.disposer + 4) = uVar2;
  *(undefined4 *)&(this->super_PromiseBase).node.ptr = uVar3;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.ptr + 4) = uVar4;
  this[2].super_PromiseBase.node.disposer = local_30;
  this[2].super_PromiseBase.node.ptr = local_28;
  local_28 = (PromiseNode *)0x0;
  if (local_1b8.exception.ptr.isSet == true) {
    Exception::~Exception(&exception->value);
  }
  return (__pid_t)this;
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }